

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_posix.c
# Opt level: O2

int condvar_init(condvar_handle *condvar)

{
  int iVar1;
  pthread_cond_t *__cond;
  int iVar2;
  
  __cond = (pthread_cond_t *)condvar->priv;
  if (__cond == (pthread_cond_t *)0x0) {
    __cond = (pthread_cond_t *)calloc(1,0x30);
    if (__cond == (pthread_cond_t *)0x0) {
      return -0xc;
    }
    condvar->priv = __cond;
  }
  iVar2 = 0;
  iVar1 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
  if (iVar1 != 0) {
    iVar2 = -iVar1;
    free(condvar->priv);
    condvar->priv = (void *)0x0;
  }
  return iVar2;
}

Assistant:

int condvar_init(struct condvar_handle *condvar)
{
	struct condvar_priv *priv = condvar->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		condvar->priv = priv;
	}

	ret = pthread_cond_init(&priv->cond, NULL);
	if (ret != 0) {
		ret = -ret;

		goto condvar_init_exit;
	}

	return 0;

condvar_init_exit:
	free(condvar->priv);
	condvar->priv = NULL;

	return ret;
}